

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O0

DdNode * cuddBddTransfer(DdManager *ddS,DdManager *ddD,DdNode *f)

{
  int iVar1;
  DdNode *local_50;
  DdNode *value;
  DdNode *key;
  st__generator *gen;
  st__table *table;
  DdNode *res;
  DdNode *f_local;
  DdManager *ddD_local;
  DdManager *ddS_local;
  
  gen = (st__generator *)0x0;
  key = (DdNode *)0x0;
  res = f;
  f_local = &ddD->sentinel;
  ddD_local = ddS;
  gen = (st__generator *)st__init_table(st__ptrcmp,st__ptrhash);
  if ((st__table *)gen != (st__table *)0x0) {
    table = (st__table *)cuddBddTransferRecur(ddD_local,(DdManager *)f_local,res,(st__table *)gen);
    if (table != (st__table *)0x0) {
      *(int *)(((ulong)table & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)table & 0xfffffffffffffffe) + 4) + 1;
    }
    key = (DdNode *)st__init_gen((st__table *)gen);
    if (key != (DdNode *)0x0) {
      while (iVar1 = st__gen((st__generator *)key,(char **)&value,(char **)&local_50), iVar1 != 0) {
        Cudd_RecursiveDeref((DdManager *)f_local,local_50);
      }
      st__free_gen((st__generator *)key);
      key = (DdNode *)0x0;
      st__free_table((st__table *)gen);
      if (table != (st__table *)0x0) {
        *(int *)(((ulong)table & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)table & 0xfffffffffffffffe) + 4) + -1;
      }
      return (DdNode *)table;
    }
    key = (DdNode *)0x0;
  }
  if (gen != (st__generator *)0x0) {
    st__free_table((st__table *)gen);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddTransfer(
  DdManager * ddS,
  DdManager * ddD,
  DdNode * f)
{
    DdNode *res;
    st__table *table = NULL;
    st__generator *gen = NULL;
    DdNode *key, *value;

    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) goto failure;
    res = cuddBddTransferRecur(ddS, ddD, f, table);
    if (res != NULL) cuddRef(res);

    /* Dereference all elements in the table and dispose of the table.
    ** This must be done also if res is NULL to avoid leaks in case of
    ** reordering. */
    gen = st__init_gen(table);
    if (gen == NULL) goto failure;
    while ( st__gen(gen, (const char **)&key, (char **)&value)) {
        Cudd_RecursiveDeref(ddD, value);
    }
    st__free_gen(gen); gen = NULL;
    st__free_table(table); table = NULL;

    if (res != NULL) cuddDeref(res);
    return(res);

failure:
    /* No need to free gen because it is always NULL here. */
    if (table != NULL) st__free_table(table);
    return(NULL);

}